

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O2

void __thiscall KktChStep::makeKKTCheck(KktChStep *this)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> rD;
  vector<double,_std::allocator<double>_> cD;
  vector<double,_std::allocator<double>_> cV;
  KktCheck checker;
  _Vector_base<double,_std::allocator<double>_> local_218;
  _Vector_base<double,_std::allocator<double>_> local_1f8;
  _Vector_base<double,_std::allocator<double>_> local_1d8;
  KktCheck local_1c0;
  
  memset(&local_1c0.Astart,0,0x108);
  local_1c0.rIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c0.rIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c0.rIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0.cIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c0.cIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c0.cIndexRev.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c0.colValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c0.colValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0.colValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0.colDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c0.colDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0.colDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0.rowDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c0.rowDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c0.rowDual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resizeProblemMatrix(this,&local_1c0);
  KktCheck::setMatrix(&local_1c0,&this->Astart,&this->Aindex,&this->Avalue);
  KktCheck::setBounds(&local_1c0,&this->colUpper,&this->colLower);
  KktCheck::setNumbersCostRHS
            (&local_1c0,this->numCol,this->numRow,&this->rowLower,&this->rowUpper,&this->colCost);
  if (this->print != 0) {
    local_1c0.print = this->print;
  }
  local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&local_1d8,(long)this->numCol);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&local_1f8,(long)this->numCol);
  piVar1 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->RnumCol;
  if (this->RnumCol < 1) {
    uVar4 = uVar5;
  }
  iVar6 = 0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (piVar1[uVar5] != 0) {
      local_1d8._M_impl.super__Vector_impl_data._M_start[iVar6] = pdVar2[uVar5];
      local_1f8._M_impl.super__Vector_impl_data._M_start[iVar6] = pdVar3[uVar5];
      iVar6 = iVar6 + 1;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&local_218,(long)this->numRow);
  piVar1 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->RnumRow;
  if (this->RnumRow < 1) {
    uVar4 = uVar5;
  }
  iVar6 = 0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (piVar1[uVar5] != 0) {
      local_218._M_impl.super__Vector_impl_data._M_start[iVar6] = pdVar2[uVar5];
      iVar6 = iVar6 + 1;
    }
  }
  KktCheck::passSolution
            (&local_1c0,(vector<double,_std::allocator<double>_> *)&local_1d8,
             (vector<double,_std::allocator<double>_> *)&local_1f8,
             (vector<double,_std::allocator<double>_> *)&local_218);
  KktCheck::checkKKT(&local_1c0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_218);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1f8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1d8);
  KktCheck::~KktCheck(&local_1c0);
  return;
}

Assistant:

void KktChStep::makeKKTCheck() {
	KktCheck checker;
	resizeProblemMatrix(checker);
	//KktCheck checker;
	checker.setMatrix(Astart, Aindex, Avalue);
	checker.setBounds(colUpper, colLower);
	checker.setNumbersCostRHS(numCol, numRow, rowLower, rowUpper, colCost);
	if (print) 	
		checker.print = print;
	
	//resize and pass solutions
	vector<double> cV;
    vector<double> cD;
    vector<double> rD;
    
    cV.resize(numCol);
    cD.resize(numCol);    
    
    int k=0;
    for (int i=0;i<RnumCol;i++)
    	if (flagCol[i]) {
    		cV[k]  = colValue[i];
    		cD[k] = colDual[i];
    		k++;
	    }
    
    rD.resize(numRow);
    k=0;
    for (int i=0;i<RnumRow;i++)
    	if (flagRow[i]) {
    		rD[k] = rowDual[i];
    		k++;
	    }
	
	
	
	checker.passSolution(cV, cD, rD);
	checker.checkKKT();
	}